

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

string * __thiscall
util::make_string<char_const(&)[19],CylHead&,char_const(&)[9],unsigned_char&,char_const(&)[8],int&>
          (string *__return_storage_ptr__,util *this,char (*args) [19],CylHead *args_1,
          char (*args_2) [9],uchar *args_3,char (*args_4) [8],int *args_5)

{
  size_t sVar1;
  ostringstream ss;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  sVar1 = strlen((char *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)this,sVar1);
  fmt_abi_cxx11_(&local_1c8,"cyl %u head %u",(ulong)*(uint *)*args,(ulong)*(uint *)(*args + 4));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  sVar1 = strlen((char *)args_1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)args_1,sVar1);
  std::ostream::operator<<((ostream *)local_1a8,(uint)(byte)(*args_2)[0]);
  sVar1 = strlen((char *)args_3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)args_3,sVar1);
  std::ostream::operator<<((ostream *)local_1a8,*(int *)*args_4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}